

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fverb.cpp
# Opt level: O2

void __thiscall Fverb::process(Fverb *this,float *in0,float *in1,float *out0,float *out1,uint count)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int iVar13;
  _Head_base<0UL,_Fverb::BasicDsp_*,_false> _Var14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  uint uVar34;
  uint uVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  uint uVar42;
  float fVar43;
  float fVar44;
  uint uVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  int local_e0;
  
  _Var14._M_head_impl =
       (this->fDsp)._M_t.
       super___uniq_ptr_impl<Fverb::BasicDsp,_std::default_delete<Fverb::BasicDsp>_>._M_t.
       super__Tuple_impl<0UL,_Fverb::BasicDsp_*,_std::default_delete<Fverb::BasicDsp>_>.
       super__Head_base<0UL,_Fverb::BasicDsp_*,_false>._M_head_impl;
  fVar1 = *(float *)&_Var14._M_head_impl[2]._vptr_BasicDsp;
  fVar2 = *(float *)&_Var14._M_head_impl[3]._vptr_BasicDsp;
  fVar3 = *(float *)((long)(_Var14._M_head_impl + 2) + 4);
  fVar4 = *(float *)&_Var14._M_head_impl[5]._vptr_BasicDsp;
  fVar5 = *(float *)&_Var14._M_head_impl[0x10007]._vptr_BasicDsp;
  fVar6 = *(float *)((long)(_Var14._M_head_impl + 0x10007) + 4);
  fVar32 = *(float *)&_Var14._M_head_impl[0x10009]._vptr_BasicDsp;
  fVar30 = expf((*(float *)((long)(_Var14._M_head_impl + 0x10009) + 4) * -6.2831855 + 0.0) * fVar32)
  ;
  fVar31 = expf((*(float *)&_Var14._M_head_impl[0x1000c]._vptr_BasicDsp * -6.2831855 + 0.0) * fVar32
               );
  fVar7 = *(float *)((long)(_Var14._M_head_impl + 0x1000e) + 4);
  fVar8 = *(float *)&_Var14._M_head_impl[0x10413]._vptr_BasicDsp;
  fVar9 = *(float *)&_Var14._M_head_impl[0x11018]._vptr_BasicDsp;
  fVar10 = *(float *)((long)(_Var14._M_head_impl + 0x21019) + 4);
  fVar11 = *(float *)&_Var14._M_head_impl[0x2101b]._vptr_BasicDsp;
  fVar32 = expf((*(float *)(&DAT_00128120 + (long)_Var14._M_head_impl) * -6.2831855 + 0.0) * fVar32)
  ;
  uVar16 = 0;
  uVar20 = (ulong)count;
  if ((int)count < 1) {
    uVar20 = uVar16;
  }
  iVar13 = *(int *)((long)(_Var14._M_head_impl + 6) + 4);
  local_e0 = *(int *)&_Var14._M_head_impl[0x21022]._vptr_BasicDsp;
  iVar21 = *(int *)&_Var14._M_head_impl[0x54034]._vptr_BasicDsp;
  iVar17 = *(int *)&_Var14._M_head_impl[0x21021]._vptr_BasicDsp;
  iVar23 = *(int *)&_Var14._M_head_impl[0x54033]._vptr_BasicDsp;
  for (; uVar20 != uVar16; uVar16 = uVar16 + 1) {
    iVar15 = (int)uVar16;
    uVar25 = iVar13 + iVar15;
    fVar47 = *(float *)((long)(_Var14._M_head_impl + 3) + 4);
    fVar52 = *(float *)((long)(_Var14._M_head_impl + 4) + 4) * fVar47 + fVar3 * fVar1;
    *(float *)&_Var14._M_head_impl[4]._vptr_BasicDsp = fVar52;
    fVar53 = fVar52 + 0.15;
    fVar36 = *(float *)&_Var14._M_head_impl[6]._vptr_BasicDsp * fVar47 + fVar4 * fVar1;
    *(float *)((long)(_Var14._M_head_impl + 5) + 4) = fVar36;
    uVar24 = (ulong)(uVar25 & 0x1ffff);
    *(float *)((long)(_Var14._M_head_impl + 7) + uVar24 * 4) = in1[uVar16] * fVar36;
    fVar33 = *(float *)((long)(_Var14._M_head_impl + 0x10008) + 4) * fVar47 + fVar6 * fVar5;
    *(float *)&_Var14._M_head_impl[0x10008]._vptr_BasicDsp = fVar33;
    fVar12 = *(float *)((long)(_Var14._M_head_impl + 1) + 4);
    iVar22 = (int)(fVar33 * fVar12);
    if (iVar22 < 1) {
      iVar22 = 0;
    }
    if (0xffff < iVar22) {
      iVar22 = 0x10000;
    }
    fVar46 = *(float *)((long)(_Var14._M_head_impl + 0x1000a) + 4) * fVar47 + fVar30 * fVar2;
    *(float *)&_Var14._M_head_impl[0x1000a]._vptr_BasicDsp = fVar46;
    iVar26 = iVar13 + iVar15;
    uVar28 = (ulong)(iVar26 - iVar22 & 0x1ffff);
    fVar38 = *(float *)((long)(_Var14._M_head_impl + 0x1000b) + 4) * fVar46 +
             *(float *)((long)(_Var14._M_head_impl + 7) + uVar28 * 4);
    *(float *)&_Var14._M_head_impl[0x1000b]._vptr_BasicDsp = fVar38;
    fVar41 = *(float *)&_Var14._M_head_impl[0x1000d]._vptr_BasicDsp * fVar47 + fVar31 * fVar2;
    *(float *)((long)(_Var14._M_head_impl + 0x1000c) + 4) = fVar41;
    fVar33 = *(float *)&_Var14._M_head_impl[0x1000e]._vptr_BasicDsp;
    fVar39 = fVar38 * (1.0 - fVar46) + fVar41 * fVar33;
    *(float *)((long)(_Var14._M_head_impl + 0x1000d) + 4) = fVar39;
    fVar37 = fVar41 + 1.0;
    fVar43 = fVar37 * -0.5 + 0.0;
    fVar48 = *(float *)((long)(_Var14._M_head_impl + 0x1000f) + 4) * fVar47 + fVar7 * fVar1;
    *(float *)&_Var14._M_head_impl[0x1000f]._vptr_BasicDsp = fVar48;
    fVar38 = *(float *)&_Var14._M_head_impl[0x10211]._vptr_BasicDsp;
    fVar39 = (fVar39 * fVar37 * 0.5 + fVar33 * fVar43) - fVar48 * fVar38;
    uVar27 = (ulong)(uVar25 & 0x3ff);
    *(float *)((long)(_Var14._M_head_impl + 0x10010) + uVar27 * 4) = fVar39;
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x10210) + 4) =
         *(undefined4 *)
          ((long)(_Var14._M_head_impl + 0x10010) +
          (ulong)(iVar26 - *(int *)&_Var14._M_head_impl[0x10210]._vptr_BasicDsp & 0x3ff) * 4);
    fVar33 = *(float *)((long)(_Var14._M_head_impl + 0x10412) + 4);
    fVar39 = (fVar39 * fVar48 + fVar38) - fVar48 * fVar33;
    *(float *)((long)(_Var14._M_head_impl + 0x10211) + 4U + uVar27 * 4) = fVar39;
    *(undefined4 *)&_Var14._M_head_impl[0x10412]._vptr_BasicDsp =
         *(undefined4 *)
          ((long)(_Var14._M_head_impl + 0x10211) + 4U +
          (ulong)(iVar26 - *(int *)((long)(_Var14._M_head_impl + 0x10411) + 4) & 0x3ff) * 4);
    fVar44 = *(float *)&_Var14._M_head_impl[0x10414]._vptr_BasicDsp * fVar47 + fVar8 * fVar1;
    *(float *)((long)(_Var14._M_head_impl + 0x10413) + 4) = fVar44;
    fVar38 = *(float *)((long)(_Var14._M_head_impl + 0x10c15) + 4);
    fVar39 = (fVar39 * fVar48 + fVar33) - fVar44 * fVar38;
    *(float *)((long)(_Var14._M_head_impl + 0x10414) + 4U + (ulong)(uVar25 & 0xfff) * 4) = fVar39;
    *(undefined4 *)&_Var14._M_head_impl[0x10c15]._vptr_BasicDsp =
         *(undefined4 *)
          ((long)(_Var14._M_head_impl + 0x10414) + 4U +
          (ulong)(iVar26 - *(int *)((long)(_Var14._M_head_impl + 0x10c14) + 4) & 0xfff) * 4);
    fVar33 = *(float *)&_Var14._M_head_impl[0x11017]._vptr_BasicDsp;
    fVar40 = (fVar39 * fVar44 + fVar38) - fVar44 * fVar33;
    *(float *)((long)(_Var14._M_head_impl + 0x10c16) + (ulong)(uVar25 & 0x7ff) * 4) = fVar40;
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x11016) + 4) =
         *(undefined4 *)
          ((long)(_Var14._M_head_impl + 0x10c16) +
          (ulong)(iVar26 - *(int *)&_Var14._M_head_impl[0x11016]._vptr_BasicDsp & 0x7ff) * 4);
    fVar39 = *(float *)&_Var14._M_head_impl[0x11019]._vptr_BasicDsp * fVar47 + fVar1 * fVar9;
    *(float *)((long)(_Var14._M_head_impl + 0x11018) + 4) = fVar39;
    fVar38 = *(float *)&_Var14._M_head_impl[0x21023]._vptr_BasicDsp;
    fVar33 = *(float *)((long)(_Var14._M_head_impl + 0x5a038) + 4U +
                       (ulong)(iVar26 - *(int *)((long)(_Var14._M_head_impl + 0x11017) + 4) & 0x7fff
                              ) * 4) * fVar52 + fVar39 * fVar38 + fVar40 * fVar44 + fVar33;
    *(float *)((long)(_Var14._M_head_impl + 0x11019) + 4U + uVar24 * 4) = fVar33;
    fVar40 = *(float *)((long)(_Var14._M_head_impl + 0x2101a) + 4) * fVar47 + fVar5 * fVar10;
    *(float *)&_Var14._M_head_impl[0x2101a]._vptr_BasicDsp = fVar40;
    fVar49 = *(float *)&_Var14._M_head_impl[0x2101c]._vptr_BasicDsp * fVar47 + fVar11 * fVar2;
    *(float *)((long)(_Var14._M_head_impl + 0x2101b) + 4) = fVar49;
    fVar49 = fVar49 * *(float *)&_Var14._M_head_impl[0x10009]._vptr_BasicDsp +
             *(float *)&_Var14._M_head_impl[0x2101d]._vptr_BasicDsp;
    fVar49 = fVar49 - (float)(int)fVar49;
    *(float *)((long)(_Var14._M_head_impl + 0x2101c) + 4) = fVar49;
    iVar22 = (int)(((float)(&(anonymous_namespace)::ftbl0mydspSIG0)
                           [(int)(((0.25 - (float)(int)(fVar49 + 0.25)) + fVar49) * 65536.0)] *
                    fVar40 + 0.030509727) * fVar12) + -1;
    uVar42 = *(uint *)&_Var14._M_head_impl[0x2101e]._vptr_BasicDsp;
    uVar34 = uVar42;
    if (iVar22 == local_e0) {
      uVar34 = 0;
    }
    fVar50 = *(float *)&_Var14._M_head_impl[0x21020]._vptr_BasicDsp;
    uVar45 = *(uint *)((long)(_Var14._M_head_impl + 0x2101d) + 4);
    uVar34 = -(uint)(fVar50 == 1.0) & uVar34;
    iVar19 = iVar17;
    if (iVar22 != local_e0) {
      iVar19 = iVar22;
    }
    if (fVar50 < 1.0) {
      iVar19 = iVar17;
    }
    uVar35 = uVar45;
    if (iVar22 == iVar17) {
      uVar35 = uVar34;
    }
    uVar29 = -(uint)(*(float *)&_Var14._M_head_impl[0x2101f]._vptr_BasicDsp != 0.0);
    fVar51 = (float)(uVar29 & -(uint)(fVar50 < 1.0) &
                              (uint)*(float *)&_Var14._M_head_impl[0x2101f]._vptr_BasicDsp &
                              -(uint)(0.0 < fVar50) |
                    ~uVar29 & (~-(uint)(fVar50 == 0.0) & uVar34 | uVar35 & -(uint)(fVar50 == 0.0)));
    *(float *)((long)(_Var14._M_head_impl + 0x2101e) + 4) = fVar51;
    fVar51 = fVar51 + fVar50;
    if (1.0 <= fVar51) {
      fVar51 = 1.0;
    }
    if (fVar51 <= 0.0) {
      fVar51 = 0.0;
    }
    *(float *)((long)(_Var14._M_head_impl + 0x2101f) + 4) = fVar51;
    if (iVar22 == iVar17) {
      iVar22 = local_e0;
    }
    if (fVar50 <= 0.0) {
      local_e0 = iVar22;
    }
    *(int *)((long)(_Var14._M_head_impl + 0x21020) + 4) = iVar19;
    *(int *)((long)(_Var14._M_head_impl + 0x21021) + 4) = local_e0;
    iVar17 = iVar19;
    if (0xffff < iVar19) {
      iVar17 = 0x10000;
    }
    if (iVar17 < 1) {
      iVar17 = 0;
    }
    fVar50 = *(float *)((long)(_Var14._M_head_impl + 0x11019) + 4U +
                       (ulong)(iVar26 - iVar17 & 0x1ffff) * 4);
    iVar17 = local_e0;
    if (0xffff < local_e0) {
      iVar17 = 0x10000;
    }
    if (fVar53 <= 0.25) {
      fVar53 = 0.25;
    }
    if (0.5 <= fVar53) {
      fVar53 = 0.5;
    }
    if (iVar17 < 1) {
      iVar17 = 0;
    }
    *(float *)((long)(_Var14._M_head_impl + 0x21022) + 4) =
         fVar51 * (*(float *)((long)(_Var14._M_head_impl + 0x11019) + 4U +
                             (ulong)(iVar26 - iVar17 & 0x1ffff) * 4) - fVar50) + fVar50;
    fVar38 = fVar38 + (0.0 - fVar33 * fVar39);
    uVar18 = (ulong)(uVar25 & 0x7fff);
    *(float *)((long)(_Var14._M_head_impl + 0x21023) + 4U + uVar18 * 4) = fVar38;
    fVar50 = fVar47 * *(float *)(&DAT_00128128 + (long)_Var14._M_head_impl) + fVar32 * fVar2;
    *(float *)(&DAT_00128124 + (long)_Var14._M_head_impl) = fVar50;
    fVar33 = *(float *)(&DAT_00128130 + (long)_Var14._M_head_impl) * fVar50 +
             *(float *)((long)(_Var14._M_head_impl + 0x21023) + 4U +
                       (ulong)(iVar26 - *(int *)(&DAT_0012811c + (long)_Var14._M_head_impl) & 0x7fff
                              ) * 4);
    *(float *)(&DAT_0012812c + (long)_Var14._M_head_impl) = fVar33;
    fVar51 = 1.0 - fVar50;
    fVar47 = *(float *)(&DAT_0014813c + (long)_Var14._M_head_impl);
    fVar54 = fVar53 * fVar47 + fVar52 * fVar33 * fVar51;
    *(float *)(&DAT_00128134 + (long)&(_Var14._M_head_impl)->_vptr_BasicDsp + uVar18 * 4) = fVar54;
    *(undefined4 *)(&DAT_00148138 + (long)_Var14._M_head_impl) =
         *(undefined4 *)
          (&DAT_00128134 +
          (long)&(_Var14._M_head_impl)->_vptr_BasicDsp +
          (ulong)(iVar26 - *(int *)(&DAT_00148134 + (long)_Var14._M_head_impl) & 0x7fff) * 4);
    *(float *)(&DAT_00148140 + (long)&(_Var14._M_head_impl)->_vptr_BasicDsp + uVar18 * 4) =
         (0.0 - fVar54 * fVar53) + fVar47;
    *(float *)((long)(_Var14._M_head_impl + 0x2d028) + (ulong)(uVar25 & 0x3fff) * 4) =
         fVar33 * fVar51;
    *(float *)((long)(_Var14._M_head_impl + 0x2f028) + uVar18 * 4) = fVar38;
    *(float *)((long)(_Var14._M_head_impl + 0x33028) + uVar24 * 4) = fVar36 * in0[uVar16];
    fVar47 = fVar46 * *(float *)((long)(_Var14._M_head_impl + 0x43028) + 4) +
             *(float *)((long)(_Var14._M_head_impl + 0x33028) + uVar28 * 4);
    *(float *)&_Var14._M_head_impl[0x43028]._vptr_BasicDsp = fVar47;
    fVar33 = (1.0 - fVar46) * fVar47 +
             fVar41 * *(float *)((long)(_Var14._M_head_impl + 0x43029) + 4);
    *(float *)&_Var14._M_head_impl[0x43029]._vptr_BasicDsp = fVar33;
    fVar47 = *(float *)&_Var14._M_head_impl[0x4322b]._vptr_BasicDsp;
    fVar36 = (fVar37 * fVar33 * 0.5 + fVar43 * *(float *)((long)(_Var14._M_head_impl + 0x43029) + 4)
             ) - fVar48 * fVar47;
    *(float *)((long)(_Var14._M_head_impl + 0x4302a) + uVar27 * 4) = fVar36;
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x4322a) + 4) =
         *(undefined4 *)
          ((long)(_Var14._M_head_impl + 0x4302a) +
          (ulong)(iVar26 - *(int *)&_Var14._M_head_impl[0x4322a]._vptr_BasicDsp & 0x3ff) * 4);
    fVar33 = *(float *)((long)(_Var14._M_head_impl + 0x4342c) + 4);
    fVar36 = (fVar36 * fVar48 + fVar47) - fVar48 * fVar33;
    *(float *)((long)(_Var14._M_head_impl + 0x4322b) + 4U + uVar27 * 4) = fVar36;
    *(undefined4 *)&_Var14._M_head_impl[0x4342c]._vptr_BasicDsp =
         *(undefined4 *)
          ((long)(_Var14._M_head_impl + 0x4322b) + 4U +
          (ulong)(iVar26 - *(int *)((long)(_Var14._M_head_impl + 0x4342b) + 4) & 0x3ff) * 4);
    fVar47 = *(float *)&_Var14._M_head_impl[0x43c2e]._vptr_BasicDsp;
    fVar36 = (fVar36 * fVar48 + fVar33) - fVar44 * fVar47;
    *(float *)((long)(_Var14._M_head_impl + 0x4342d) + (ulong)(uVar25 & 0xfff) * 4) = fVar36;
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x43c2d) + 4) =
         *(undefined4 *)
          ((long)(_Var14._M_head_impl + 0x4342d) +
          (ulong)(iVar26 - *(int *)&_Var14._M_head_impl[0x43c2d]._vptr_BasicDsp & 0xfff) * 4);
    fVar33 = *(float *)((long)(_Var14._M_head_impl + 0x4402f) + 4);
    fVar36 = (fVar36 * fVar44 + fVar47) - fVar44 * fVar33;
    *(float *)((long)(_Var14._M_head_impl + 0x43c2e) + 4U + (ulong)(uVar25 & 0x7ff) * 4) = fVar36;
    *(undefined4 *)&_Var14._M_head_impl[0x4402f]._vptr_BasicDsp =
         *(undefined4 *)
          ((long)(_Var14._M_head_impl + 0x43c2e) + 4U +
          (ulong)(iVar26 - *(int *)((long)(_Var14._M_head_impl + 0x4402e) + 4) & 0x7ff) * 4);
    fVar47 = *(float *)&_Var14._M_head_impl[0x54035]._vptr_BasicDsp;
    fVar33 = *(float *)(&DAT_00148140 +
                       (long)&(_Var14._M_head_impl)->_vptr_BasicDsp +
                       (ulong)(iVar26 - *(int *)&_Var14._M_head_impl[0x44030]._vptr_BasicDsp &
                              0x7fff) * 4) * fVar52 + fVar39 * fVar47 + fVar36 * fVar44 + fVar33;
    *(float *)((long)(_Var14._M_head_impl + 0x44030) + 4U + uVar24 * 4) = fVar33;
    iVar17 = (int)(fVar12 * (fVar40 * (float)(&(anonymous_namespace)::ftbl0mydspSIG0)
                                             [(int)(fVar49 * 65536.0)] + 0.025603978)) + -1;
    if (iVar17 == iVar21) {
      uVar42 = 0;
    }
    fVar12 = *(float *)&_Var14._M_head_impl[0x54032]._vptr_BasicDsp;
    iVar22 = iVar23;
    if (iVar17 != iVar21) {
      iVar22 = iVar17;
    }
    uVar42 = -(uint)(fVar12 == 1.0) & uVar42;
    if (fVar12 < 1.0) {
      iVar22 = iVar23;
    }
    if (iVar17 == iVar23) {
      uVar45 = uVar42;
    }
    uVar34 = -(uint)(*(float *)&_Var14._M_head_impl[0x54031]._vptr_BasicDsp != 0.0);
    fVar36 = (float)(uVar34 & -(uint)(fVar12 < 1.0) &
                              (uint)*(float *)&_Var14._M_head_impl[0x54031]._vptr_BasicDsp &
                              -(uint)(0.0 < fVar12) |
                    ~uVar34 & (~-(uint)(fVar12 == 0.0) & uVar42 | uVar45 & -(uint)(fVar12 == 0.0)));
    *(float *)((long)(_Var14._M_head_impl + 0x54030) + 4) = fVar36;
    fVar36 = fVar36 + fVar12;
    if (1.0 <= fVar36) {
      fVar36 = 1.0;
    }
    if (fVar36 <= 0.0) {
      fVar36 = 0.0;
    }
    *(float *)((long)(_Var14._M_head_impl + 0x54031) + 4) = fVar36;
    if (iVar17 == iVar23) {
      iVar17 = iVar21;
    }
    if (fVar12 <= 0.0) {
      iVar21 = iVar17;
    }
    *(int *)((long)(_Var14._M_head_impl + 0x54032) + 4) = iVar22;
    *(int *)((long)(_Var14._M_head_impl + 0x54033) + 4) = iVar21;
    iVar17 = iVar22;
    if (0xffff < iVar22) {
      iVar17 = 0x10000;
    }
    if (iVar17 < 1) {
      iVar17 = 0;
    }
    fVar12 = *(float *)((long)(_Var14._M_head_impl + 0x44030) + 4U +
                       (ulong)(iVar26 - iVar17 & 0x1ffff) * 4);
    iVar17 = iVar21;
    if (0xffff < iVar21) {
      iVar17 = 0x10000;
    }
    if (iVar17 < 1) {
      iVar17 = 0;
    }
    *(float *)((long)(_Var14._M_head_impl + 0x54034) + 4) =
         fVar36 * (*(float *)((long)(_Var14._M_head_impl + 0x44030) + 4U +
                             (ulong)(iVar26 - iVar17 & 0x1ffff) * 4) - fVar12) + fVar12;
    fVar47 = fVar47 + (0.0 - fVar39 * fVar33);
    *(float *)((long)(_Var14._M_head_impl + 0x54035) + 4U + uVar18 * 4) = fVar47;
    fVar36 = fVar50 * *(float *)((long)(_Var14._M_head_impl + 0x58036) + 4) +
             *(float *)((long)(_Var14._M_head_impl + 0x54035) + 4U +
                       (ulong)(iVar26 - *(int *)((long)(_Var14._M_head_impl + 0x58035) + 4) & 0x7fff
                              ) * 4);
    *(float *)&_Var14._M_head_impl[0x58036]._vptr_BasicDsp = fVar36;
    fVar12 = *(float *)&_Var14._M_head_impl[0x5a038]._vptr_BasicDsp;
    fVar33 = fVar53 * fVar12 + fVar52 * fVar51 * fVar36;
    *(float *)((long)(_Var14._M_head_impl + 0x58037) + (ulong)(uVar25 & 0x3fff) * 4) = fVar33;
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x5a037) + 4) =
         *(undefined4 *)
          ((long)(_Var14._M_head_impl + 0x58037) +
          (ulong)(iVar26 - *(int *)&_Var14._M_head_impl[0x5a037]._vptr_BasicDsp & 0x3fff) * 4);
    *(float *)((long)(_Var14._M_head_impl + 0x5a038) + 4U + uVar18 * 4) =
         (0.0 - fVar33 * fVar53) + fVar12;
    *(float *)((long)(_Var14._M_head_impl + 0x5e038) + 4U + (ulong)(uVar25 & 0x1fff) * 4) =
         fVar36 * fVar51;
    *(float *)((long)(_Var14._M_head_impl + 0x5f038) + 4U + uVar18 * 4) = fVar47;
    out0[uVar16] = ((*(float *)((long)(_Var14._M_head_impl + 0x2f028) +
                               (ulong)(iVar26 - *(int *)((long)(_Var14._M_head_impl + 0x63038) + 4)
                                      & 0x7fff) * 4) +
                     *(float *)((long)(_Var14._M_head_impl + 0x2f028) +
                               (ulong)(iVar26 - *(int *)&_Var14._M_head_impl[0x63039]._vptr_BasicDsp
                                      & 0x7fff) * 4) +
                    *(float *)(&DAT_00148140 +
                              (long)&(_Var14._M_head_impl)->_vptr_BasicDsp +
                              (ulong)(iVar26 - *(int *)((long)(_Var14._M_head_impl + 0x63039) + 4) &
                                     0x7fff) * 4)) -
                   (*(float *)((long)(_Var14._M_head_impl + 0x2d028) +
                              (ulong)(iVar26 - *(int *)&_Var14._M_head_impl[0x6303a]._vptr_BasicDsp
                                     & 0x3fff) * 4) +
                    *(float *)((long)(_Var14._M_head_impl + 0x5f038) + 4U +
                              (ulong)(iVar26 - *(int *)((long)(_Var14._M_head_impl + 0x6303a) + 4) &
                                     0x7fff) * 4) +
                    *(float *)((long)(_Var14._M_head_impl + 0x5e038) + 4U +
                              (ulong)(iVar26 - *(int *)&_Var14._M_head_impl[0x6303b]._vptr_BasicDsp
                                     & 0x1fff) * 4) +
                   *(float *)((long)(_Var14._M_head_impl + 0x5a038) + 4U +
                             (ulong)(iVar26 - *(int *)((long)(_Var14._M_head_impl + 0x6303b) + 4) &
                                    0x7fff) * 4))) * 0.6;
    out1[uVar16] = ((*(float *)((long)(_Var14._M_head_impl + 0x5f038) + 4U +
                               (ulong)(iVar26 - *(int *)&_Var14._M_head_impl[0x6303c]._vptr_BasicDsp
                                      & 0x7fff) * 4) +
                     *(float *)((long)(_Var14._M_head_impl + 0x5f038) + 4U +
                               (ulong)(iVar26 - *(int *)((long)(_Var14._M_head_impl + 0x6303c) + 4)
                                      & 0x7fff) * 4) +
                    *(float *)((long)(_Var14._M_head_impl + 0x5a038) + 4U +
                              (ulong)(iVar26 - *(int *)&_Var14._M_head_impl[0x6303d]._vptr_BasicDsp
                                     & 0x7fff) * 4)) -
                   (*(float *)((long)(_Var14._M_head_impl + 0x5e038) + 4U +
                              (ulong)(iVar26 - *(int *)((long)(_Var14._M_head_impl + 0x6303d) + 4) &
                                     0x1fff) * 4) +
                    *(float *)((long)(_Var14._M_head_impl + 0x2f028) +
                              (ulong)(iVar26 - *(int *)&_Var14._M_head_impl[0x6303e]._vptr_BasicDsp
                                     & 0x7fff) * 4) +
                    *(float *)((long)(_Var14._M_head_impl + 0x2d028) +
                              (ulong)(iVar26 - *(int *)((long)(_Var14._M_head_impl + 0x6303e) + 4) &
                                     0x3fff) * 4) +
                   *(float *)(&DAT_00148140 +
                             (long)&(_Var14._M_head_impl)->_vptr_BasicDsp +
                             (ulong)(iVar26 - *(int *)&_Var14._M_head_impl[0x6303f]._vptr_BasicDsp &
                                    0x7fff) * 4))) * 0.6;
    *(undefined4 *)((long)(_Var14._M_head_impl + 4) + 4) =
         *(undefined4 *)&_Var14._M_head_impl[4]._vptr_BasicDsp;
    *(undefined4 *)&_Var14._M_head_impl[6]._vptr_BasicDsp =
         *(undefined4 *)((long)(_Var14._M_head_impl + 5) + 4);
    *(int *)((long)(_Var14._M_head_impl + 6) + 4) = iVar13 + 1 + iVar15;
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x10008) + 4) =
         *(undefined4 *)&_Var14._M_head_impl[0x10008]._vptr_BasicDsp;
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x1000a) + 4) =
         *(undefined4 *)&_Var14._M_head_impl[0x1000a]._vptr_BasicDsp;
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x1000b) + 4) =
         *(undefined4 *)&_Var14._M_head_impl[0x1000b]._vptr_BasicDsp;
    *(undefined4 *)&_Var14._M_head_impl[0x1000d]._vptr_BasicDsp =
         *(undefined4 *)((long)(_Var14._M_head_impl + 0x1000c) + 4);
    *(undefined4 *)&_Var14._M_head_impl[0x1000e]._vptr_BasicDsp =
         *(undefined4 *)((long)(_Var14._M_head_impl + 0x1000d) + 4);
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x1000f) + 4) =
         *(undefined4 *)&_Var14._M_head_impl[0x1000f]._vptr_BasicDsp;
    *(undefined4 *)&_Var14._M_head_impl[0x10211]._vptr_BasicDsp =
         *(undefined4 *)((long)(_Var14._M_head_impl + 0x10210) + 4);
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x10412) + 4) =
         *(undefined4 *)&_Var14._M_head_impl[0x10412]._vptr_BasicDsp;
    *(undefined4 *)&_Var14._M_head_impl[0x10414]._vptr_BasicDsp =
         *(undefined4 *)((long)(_Var14._M_head_impl + 0x10413) + 4);
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x10c15) + 4) =
         *(undefined4 *)&_Var14._M_head_impl[0x10c15]._vptr_BasicDsp;
    *(undefined4 *)&_Var14._M_head_impl[0x11017]._vptr_BasicDsp =
         *(undefined4 *)((long)(_Var14._M_head_impl + 0x11016) + 4);
    *(undefined4 *)&_Var14._M_head_impl[0x11019]._vptr_BasicDsp =
         *(undefined4 *)((long)(_Var14._M_head_impl + 0x11018) + 4);
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x2101a) + 4) =
         *(undefined4 *)&_Var14._M_head_impl[0x2101a]._vptr_BasicDsp;
    *(undefined4 *)&_Var14._M_head_impl[0x2101c]._vptr_BasicDsp =
         *(undefined4 *)((long)(_Var14._M_head_impl + 0x2101b) + 4);
    *(undefined4 *)&_Var14._M_head_impl[0x2101d]._vptr_BasicDsp =
         *(undefined4 *)((long)(_Var14._M_head_impl + 0x2101c) + 4);
    *(undefined4 *)&_Var14._M_head_impl[0x2101f]._vptr_BasicDsp =
         *(undefined4 *)((long)(_Var14._M_head_impl + 0x2101e) + 4);
    *(undefined4 *)&_Var14._M_head_impl[0x21020]._vptr_BasicDsp =
         *(undefined4 *)((long)(_Var14._M_head_impl + 0x2101f) + 4);
    *(int *)&_Var14._M_head_impl[0x21021]._vptr_BasicDsp = iVar19;
    *(int *)&_Var14._M_head_impl[0x21022]._vptr_BasicDsp = local_e0;
    *(undefined4 *)&_Var14._M_head_impl[0x21023]._vptr_BasicDsp =
         *(undefined4 *)((long)(_Var14._M_head_impl + 0x21022) + 4);
    *(undefined4 *)(&DAT_00128128 + (long)_Var14._M_head_impl) =
         *(undefined4 *)(&DAT_00128124 + (long)_Var14._M_head_impl);
    *(undefined4 *)(&DAT_00128130 + (long)_Var14._M_head_impl) =
         *(undefined4 *)(&DAT_0012812c + (long)_Var14._M_head_impl);
    *(undefined4 *)(&DAT_0014813c + (long)_Var14._M_head_impl) =
         *(undefined4 *)(&DAT_00148138 + (long)_Var14._M_head_impl);
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x43028) + 4) =
         *(undefined4 *)&_Var14._M_head_impl[0x43028]._vptr_BasicDsp;
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x43029) + 4) =
         *(undefined4 *)&_Var14._M_head_impl[0x43029]._vptr_BasicDsp;
    *(undefined4 *)&_Var14._M_head_impl[0x4322b]._vptr_BasicDsp =
         *(undefined4 *)((long)(_Var14._M_head_impl + 0x4322a) + 4);
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x4342c) + 4) =
         *(undefined4 *)&_Var14._M_head_impl[0x4342c]._vptr_BasicDsp;
    *(undefined4 *)&_Var14._M_head_impl[0x43c2e]._vptr_BasicDsp =
         *(undefined4 *)((long)(_Var14._M_head_impl + 0x43c2d) + 4);
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x4402f) + 4) =
         *(undefined4 *)&_Var14._M_head_impl[0x4402f]._vptr_BasicDsp;
    *(undefined4 *)&_Var14._M_head_impl[0x54031]._vptr_BasicDsp =
         *(undefined4 *)((long)(_Var14._M_head_impl + 0x54030) + 4);
    *(undefined4 *)&_Var14._M_head_impl[0x54032]._vptr_BasicDsp =
         *(undefined4 *)((long)(_Var14._M_head_impl + 0x54031) + 4);
    *(int *)&_Var14._M_head_impl[0x54033]._vptr_BasicDsp = iVar22;
    *(int *)&_Var14._M_head_impl[0x54034]._vptr_BasicDsp = iVar21;
    *(undefined4 *)&_Var14._M_head_impl[0x54035]._vptr_BasicDsp =
         *(undefined4 *)((long)(_Var14._M_head_impl + 0x54034) + 4);
    *(undefined4 *)((long)(_Var14._M_head_impl + 0x58036) + 4) =
         *(undefined4 *)&_Var14._M_head_impl[0x58036]._vptr_BasicDsp;
    *(undefined4 *)&_Var14._M_head_impl[0x5a038]._vptr_BasicDsp =
         *(undefined4 *)((long)(_Var14._M_head_impl + 0x5a037) + 4);
    iVar17 = iVar19;
    iVar23 = iVar22;
  }
  return;
}

Assistant:

void Fverb::process(const float *in0, const float *in1, float *out0,
                    float *out1, unsigned count) noexcept
{

    mydsp &dsp = static_cast<mydsp &>(*fDsp);
    float *inputs[] = {
        const_cast<float *>(in0),
        const_cast<float *>(in1),
    };
    float *outputs[] = {
        out0,
        out1,
    };
    dsp.compute(count, inputs, outputs);
}